

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O1

Vec_Int_t * Gia_ManTransfer(Gia_Man_t *pAig,Gia_Man_t *pCof,Gia_Man_t *pNew,Vec_Int_t *vSigs)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p;
  int *piVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar4 = (int *)malloc(400);
  p->pArray = piVar4;
  if (0 < vSigs->nSize) {
    lVar7 = 0;
    do {
      iVar2 = vSigs->pArray[lVar7];
      if (((long)iVar2 < 0) || (pAig->nObjs <= iVar2)) {
LAB_006604bb:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pAig->pObjs == (Gia_Obj_t *)0x0) {
        return p;
      }
      pGVar1 = pAig->pObjs + iVar2;
      uVar3 = *(uint *)pGVar1;
      uVar6 = ~uVar3;
      if (((uVar6 & 0x9fffffff) != 0) && ((int)uVar3 < 0 || (uVar6 & 0x1fffffff) == 0)) {
        __assert_fail("Gia_ObjIsCand(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCof.c"
                      ,0x395,
                      "Vec_Int_t *Gia_ManTransfer(Gia_Man_t *, Gia_Man_t *, Gia_Man_t *, Vec_Int_t *)"
                     );
      }
      uVar3 = pGVar1->Value;
      if ((int)uVar3 < 0) {
LAB_006604da:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10c,"int Abc_Lit2Var(int)");
      }
      uVar3 = uVar3 >> 1;
      if (pCof->nObjs <= (int)uVar3) goto LAB_006604bb;
      uVar3 = pCof->pObjs[uVar3].Value;
      if (1 < uVar3 + 1) {
        if ((int)uVar3 < 0) goto LAB_006604da;
        if (0 < (long)p->nSize) {
          lVar5 = 0;
          do {
            if (p->pArray[lVar5] == uVar3 >> 1) goto LAB_0066049e;
            lVar5 = lVar5 + 1;
          } while (p->nSize != lVar5);
        }
        Vec_IntPush(p,uVar3 >> 1);
      }
LAB_0066049e:
      lVar7 = lVar7 + 1;
    } while (lVar7 < vSigs->nSize);
  }
  return p;
}

Assistant:

Vec_Int_t * Gia_ManTransfer( Gia_Man_t * pAig, Gia_Man_t * pCof, Gia_Man_t * pNew, Vec_Int_t * vSigs )
{
    Vec_Int_t * vSigsNew;
    Gia_Obj_t * pObj, * pObjF;
    int i;
    vSigsNew = Vec_IntAlloc( 100 );
    Gia_ManForEachObjVec( vSigs, pAig, pObj, i )
    {
        assert( Gia_ObjIsCand(pObj) );
        pObjF = Gia_ManObj( pCof, Abc_Lit2Var(pObj->Value) );
        if ( pObjF->Value && ~pObjF->Value )
            Vec_IntPushUnique( vSigsNew, Abc_Lit2Var(pObjF->Value) );
    }
    return vSigsNew;    
}